

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mtsr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_ptr arg1;
  uint32_t uVar1;
  TCGv_i64 arg2;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    uVar1 = SR(ctx->opcode);
    arg2 = tcg_const_i64_ppc64(tcg_ctx_00,(ulong)uVar1);
    arg1 = tcg_ctx_00->cpu_env;
    uVar1 = rS(ctx->opcode);
    gen_helper_store_sr(tcg_ctx_00,arg1,arg2,cpu_gpr[uVar1]);
    tcg_temp_free_i64(tcg_ctx_00,arg2);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_mtsr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_const_tl(tcg_ctx, SR(ctx->opcode));
    gen_helper_store_sr(tcg_ctx, tcg_ctx->cpu_env, t0, cpu_gpr[rS(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, t0);
}